

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall gl3cts::TextureSwizzle::SmokeTest::SmokeTest(SmokeTest *this,Context *context)

{
  Context *context_local;
  SmokeTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"smoke",
             "Verifies that all swizzle combinations work with all texture access routines");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SmokeTest_0322b770;
  this->m_is_ms_supported = false;
  this->m_prepare_fbo_id = 0;
  this->m_out_tex_id = 0;
  this->m_source_tex_id = 0;
  this->m_test_fbo_id = 0;
  this->m_vao_id = 0;
  return;
}

Assistant:

SmokeTest::SmokeTest(deqp::Context& context)
	: TestCase(context, "smoke", "Verifies that all swizzle combinations work with all texture access routines")
	, m_is_ms_supported(false)
	, m_prepare_fbo_id(0)
	, m_out_tex_id(0)
	, m_source_tex_id(0)
	, m_test_fbo_id(0)
	, m_vao_id(0)
{
	/* Left blank intentionally */
}